

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

GLchar * __thiscall gl4cts::EnhancedLayouts::Utils::Type::GetGLSLTypeName(Type *this)

{
  TestError *this_00;
  Type *local_20;
  GLchar *result;
  Type *this_local;
  
  if ((((this->m_n_columns == 0) || (this->m_n_rows == 0)) || (4 < this->m_n_columns)) ||
     (4 < this->m_n_rows)) {
    this_local = (Type *)0x0;
  }
  else {
    switch(this->m_basic_type) {
    case Float:
      local_20 = (Type *)GetGLSLTypeName::float_lut[this->m_n_columns - 1][this->m_n_rows - 1];
      break;
    case Double:
      local_20 = (Type *)GetGLSLTypeName::double_lut[this->m_n_columns - 1][this->m_n_rows - 1];
      break;
    case Int:
      local_20 = (Type *)GetGLSLTypeName::int_lut[this->m_n_rows - 1];
      break;
    case Uint:
      local_20 = (Type *)GetGLSLTypeName::uint_lut[this->m_n_rows - 1];
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invliad enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x1ed);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    this_local = local_20;
  }
  return (GLchar *)this_local;
}

Assistant:

const glw::GLchar* Type::GetGLSLTypeName() const
{
	static const GLchar* float_lut[4][4] = {
		{ "float", "vec2", "vec3", "vec4" },
		{ 0, "mat2", "mat2x3", "mat2x4" },
		{ 0, "mat3x2", "mat3", "mat3x4" },
		{ 0, "mat4x2", "mat4x3", "mat4" },
	};

	static const GLchar* double_lut[4][4] = {
		{ "double", "dvec2", "dvec3", "dvec4" },
		{ 0, "dmat2", "dmat2x3", "dmat2x4" },
		{ 0, "dmat3x2", "dmat3", "dmat3x4" },
		{ 0, "dmat4x2", "dmat4x3", "dmat4" },
	};

	static const GLchar* int_lut[4] = { "int", "ivec2", "ivec3", "ivec4" };

	static const GLchar* uint_lut[4] = { "uint", "uvec2", "uvec3", "uvec4" };

	const GLchar* result = 0;

	if ((1 > m_n_columns) || (1 > m_n_rows) || (4 < m_n_columns) || (4 < m_n_rows))
	{
		return 0;
	}

	switch (m_basic_type)
	{
	case Float:
		result = float_lut[m_n_columns - 1][m_n_rows - 1];
		break;
	case Double:
		result = double_lut[m_n_columns - 1][m_n_rows - 1];
		break;
	case Int:
		result = int_lut[m_n_rows - 1];
		break;
	case Uint:
		result = uint_lut[m_n_rows - 1];
		break;
	default:
		TCU_FAIL("Invliad enum");
	}

	return result;
}